

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

size_t __thiscall
trieste::PassDef::apply_special<false,true,false>(PassDef *this,Node *root,Match *match)

{
  Node *node;
  element_type *peVar1;
  element_type *peVar2;
  long lVar3;
  undefined8 *puVar4;
  char cVar5;
  bool bVar6;
  iterator iVar7;
  unsigned_long uVar8;
  ptrdiff_t pVar9;
  long lVar10;
  undefined8 *puVar11;
  iterator it;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root_1;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_a0;
  PassDef *local_90;
  unsigned_long local_88;
  NodeIt local_80;
  _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  local_78;
  long local_58;
  element_type *local_50;
  _Base_ptr local_40;
  map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
  *local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((((local_50->type_).def)->fl & 0x40) == 0) {
    local_38 = &this->pre_;
    iVar7 = CLI::std::
            _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
            ::find(&local_38->_M_t,&local_50->type_);
    local_40 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (iVar7._M_node == local_40) {
      uVar8 = 0;
    }
    else {
      CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffb0);
      uVar8 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator()
                        ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                         &iVar7._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_78);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_78._M_impl.super__Vector_impl_data._M_finish);
    }
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_50->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a0._M_ptr = (element_type *)&stack0xffffffffffffffb0;
    local_90 = this;
    local_88 = uVar8;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_78,
               (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)&local_a0);
    while (local_78._M_impl.super__Vector_impl_data._M_start !=
           local_78._M_impl.super__Vector_impl_data._M_finish) {
      node = (Node *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->
                     _vptr__Sp_counted_base;
      peVar1 = *(element_type **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->_M_use_count;
      peVar2 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)
                    (peVar2->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = *(long *)((long)(local_90->rule_map).map._M_elems +
                         (ulong)(((peVar2->type_).def)->default_map_id & 0xfffffff8));
        if (*(char *)(lVar3 + 0x418) == '\0') {
          local_a0._M_ptr =
               (element_type *)
               (peVar2->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_58 = 0;
LAB_00154e1c:
          lVar10 = local_58;
          if (local_a0._M_ptr !=
              (element_type *)
              (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              children).
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            puVar11 = *(undefined8 **)
                       (lVar3 + 0x18 +
                       (ulong)((((((local_a0._M_ptr)->
                                  super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->type_).def)->default_map_id & 0xfffffff8));
            puVar4 = (undefined8 *)puVar11[1];
            local_80._M_current = (shared_ptr<trieste::NodeDef> *)local_a0._M_ptr;
            for (puVar11 = (undefined8 *)*puVar11; puVar11 != puVar4; puVar11 = puVar11 + 0x14) {
              match->index = 0;
              ((match->captures).
               super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = false;
              local_a0._M_ptr = (element_type *)local_80._M_current;
              cVar5 = (**(code **)(*(long *)*puVar11 + 0x20))((long *)*puVar11,&local_a0,node,match)
              ;
              if (((cVar5 != '\0') &&
                  (bVar6 = std::
                           any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>
                                     (local_80._M_current,local_a0._M_ptr), !bVar6)) &&
                 (pVar9 = replace(local_90,match,(Effect<Node> *)(puVar11 + 0x10),&local_80,
                                  (NodeIt *)&local_a0,node), pVar9 != -1)) {
                local_58 = local_58 + pVar9;
                if ((local_90->direction_ & 4) == 0) {
                  local_a0._M_ptr =
                       (element_type *)
                       (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  local_a0._M_ptr =
                       (element_type *)
                       (&(local_a0._M_ptr)->super_enable_shared_from_this<trieste::NodeDef> + pVar9)
                  ;
                }
                goto LAB_00154e1c;
              }
            }
            local_a0._M_ptr = (element_type *)(local_80._M_current + 1);
            goto LAB_00154e1c;
          }
        }
        else {
          lVar10 = 0;
        }
        local_88 = local_88 + lVar10;
        local_78._M_impl.super__Vector_impl_data._M_finish =
             (pointer)&(((element_type *)
                        ((long)local_78._M_impl.super__Vector_impl_data._M_finish + -0x70))->
                       children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *(Token **)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->_M_use_count = &peVar1->type_;
        peVar2 = (peVar1->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((((peVar2->type_).def)->fl & 0x40) == 0) {
          iVar7 = CLI::std::
                  _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                  ::find(&local_38->_M_t,&peVar2->type_);
          if (iVar7._M_node != local_40) {
            CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_a0,
                       (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)peVar1);
            uVar8 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::
                    operator()((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                               &iVar7._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_a0
                              );
            local_88 = local_88 + uVar8;
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_a0._M_refcount);
          }
          local_a0._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((peVar1->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a0._M_ptr = peVar1;
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                    ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                      *)&local_78,
                     (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                      *)&local_a0);
        }
      }
    }
    CLI::std::
    _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~_Vector_base(&local_78);
    uVar8 = local_88;
  }
  else {
    uVar8 = 0;
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
  return uVar8;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }